

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

Extension * __thiscall
google::protobuf::internal::ExtensionSet::MaybeNewRepeatedExtension
          (ExtensionSet *this,FieldDescriptor *descriptor)

{
  byte bVar1;
  Arena *this_00;
  bool bVar2;
  undefined8 *puVar3;
  Nonnull<const_char_*> pcVar4;
  Extension *extension;
  Extension *local_28 [3];
  
  bVar2 = MaybeNewExtension(this,descriptor->number_,descriptor,local_28);
  if (bVar2) {
    bVar1 = descriptor->type_;
    local_28[0]->type = bVar1;
    if ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar1 * 4),10
                          ,"cpp_type(extension->type) == FieldDescriptor::CPPTYPE_MESSAGE");
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      local_28[0]->is_repeated = true;
      local_28[0]->field_0xa = local_28[0]->field_0xa | 1;
      this_00 = this->arena_;
      if (this_00 == (Arena *)0x0) {
        puVar3 = (undefined8 *)operator_new(0x18);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[2] = 0;
      }
      else {
        puVar3 = (undefined8 *)Arena::Allocate(this_00,0x18);
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3[2] = this_00;
      }
      *(undefined8 **)&(local_28[0]->field_0).int32_t_value = puVar3;
      return local_28[0];
    }
    MaybeNewRepeatedExtension();
  }
  else {
    if (local_28[0]->is_repeated == false) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (1,3,
                          "(*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL == FieldDescriptor::LABEL_REPEATED"
                         );
    }
    else {
      pcVar4 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      if ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_28[0]->type * 4) == 10)
      {
        pcVar4 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           ((ulong)*(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                                            (ulong)local_28[0]->type * 4),10,
                            "cpp_type((*extension).type) == FieldDescriptor::CPPTYPE_MESSAGE");
      }
      if (pcVar4 == (Nonnull<const_char_*>)0x0) {
        return local_28[0];
      }
      goto LAB_00325eb8;
    }
  }
  MaybeNewRepeatedExtension();
LAB_00325eb8:
  MaybeNewRepeatedExtension();
}

Assistant:

ExtensionSet::Extension* ExtensionSet::MaybeNewRepeatedExtension(
    const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    ABSL_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite> >(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED, MESSAGE);
  }
  return extension;
}